

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexchange.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  *this;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  bool help;
  allocator<char> local_328;
  allocator<char> local_327;
  allocator<char> local_326;
  allocator<char> local_325;
  allocator<char> local_324;
  allocator<char> local_323;
  allocator<char> local_322;
  allocator<char> local_321;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_320;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_318;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_310;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_308;
  environment env;
  communicator world;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  Options ops;
  Session session;
  
  diy::mpi::environment::environment(&env,argc,argv);
  diy::mpi::communicator::communicator(&world);
  Catch::Session::Session(&session);
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this = &ops.options;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.failed = false;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.args.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"blocks",&local_321);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"number of blocks",&local_322);
  opts::Option<int>((opts *)&local_308,'b',&local_200,&RexchangeFixture::nblocks,&local_220);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_308);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"thread",&local_323);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"number of threads",&local_324);
  opts::Option<int>((opts *)&local_310,'t',&local_240,&RexchangeFixture::threads,&local_260);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_310);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"memory",&local_325);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"number of blocks to keep in memory",&local_326);
  opts::Option<int>((opts *)&local_318,'m',&local_280,&RexchangeFixture::mem_blocks,&local_2a0);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_318);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"help",&local_327);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"show help",&local_328);
  opts::Option<bool>((opts *)&local_320,'h',&local_2c0,&help,&local_2e0);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_320);
  if (local_320._M_head_impl != (BasicOption *)0x0) {
    (*(local_320._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_320._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  if (local_318._M_head_impl != (BasicOption *)0x0) {
    (*(local_318._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_318._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  if (local_310._M_head_impl != (BasicOption *)0x0) {
    (*(local_310._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_310._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  if (local_308._M_head_impl != (BasicOption *)0x0) {
    (*(local_308._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_308._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  bVar1 = opts::Options::parse(&ops,argc,argv);
  if ((bVar1) && (help != true)) {
    iVar2 = Catch::Session::run(&session);
  }
  else {
    iVar2 = 1;
    if (world.rank_ == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Usage: ");
      poVar3 = std::operator<<(poVar3,*argv);
      std::operator<<(poVar3," [OPTIONS]\n");
      std::operator<<((ostream *)&std::cout,"Sends and receives messages outside of the link.\n");
      opts::operator<<((ostream *)&std::cout,&ops);
    }
  }
  opts::Options::~Options(&ops);
  Catch::Session::~Session(&session);
  diy::mpi::communicator::~communicator(&world);
  diy::mpi::environment::~environment(&env);
  return iVar2;
}

Assistant:

int main(int argc, char* argv[])
{
    diy::mpi::environment     env(argc, argv);
    diy::mpi::communicator    world;

    Catch::Session session;

    bool help;

    // get command line arguments
    using namespace opts;
    Options ops;
    ops
        >> Option('b', "blocks",  RexchangeFixture::nblocks,        "number of blocks")
        >> Option('t', "thread",  RexchangeFixture::threads,        "number of threads")
        >> Option('m', "memory",  RexchangeFixture::mem_blocks,     "number of blocks to keep in memory")
        >> Option('h', "help",    help,                             "show help")
        ;

    if (!ops.parse(argc,argv) || help)
    {
        if (world.rank() == 0)
        {
            std::cout << "Usage: " << argv[0] << " [OPTIONS]\n";
            std::cout << "Sends and receives messages outside of the link.\n";
            std::cout << ops;
        }
        return 1;
    }

    return session.run();
}